

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O3

size_t WebRtc_ReadBuffer(RingBuffer *self,void **data_ptr,void *data,size_t element_count)

{
  size_t sVar1;
  size_t sVar2;
  char *__src;
  ulong uVar3;
  size_t __n;
  char *__src_00;
  ulong uVar4;
  size_t __n_00;
  
  if (data == (void *)0x0 || self == (RingBuffer *)0x0) {
    return 0;
  }
  sVar1 = self->read_pos;
  if (self->rw_wrap == SAME_WRAP) {
    uVar3 = self->write_pos - sVar1;
    uVar4 = self->element_count - sVar1;
  }
  else {
    uVar4 = self->element_count - sVar1;
    uVar3 = self->write_pos + uVar4;
  }
  if (uVar3 < element_count) {
    element_count = uVar3;
  }
  sVar2 = self->element_size;
  __src = self->data;
  __src_00 = __src + sVar1 * sVar2;
  if (element_count < uVar4 || element_count - uVar4 == 0) {
    __n_00 = sVar2 * element_count;
LAB_00146fa7:
    if (data_ptr == (void **)0x0) {
      memcpy(data,__src_00,__n_00);
      goto LAB_00146fbf;
    }
  }
  else {
    __n_00 = uVar4 * sVar2;
    __n = (element_count - uVar4) * sVar2;
    if (__n == 0) goto LAB_00146fa7;
    memcpy(data,__src_00,__n_00);
    memcpy((void *)(__n_00 + (long)data),__src,__n);
    __src_00 = (char *)data;
    if (data_ptr == (void **)0x0) goto LAB_00146fbf;
  }
  *data_ptr = __src_00;
LAB_00146fbf:
  WebRtc_MoveReadPtr(self,(int)element_count);
  return element_count;
}

Assistant:

size_t WebRtc_ReadBuffer(RingBuffer* self,
                         void** data_ptr,
                         void* data,
                         size_t element_count) {

  if (self == NULL) {
    return 0;
  }
  if (data == NULL) {
    return 0;
  }

  {
    void* buf_ptr_1 = NULL;
    void* buf_ptr_2 = NULL;
    size_t buf_ptr_bytes_1 = 0;
    size_t buf_ptr_bytes_2 = 0;
    const size_t read_count = GetBufferReadRegions(self,
                                                   element_count,
                                                   &buf_ptr_1,
                                                   &buf_ptr_bytes_1,
                                                   &buf_ptr_2,
                                                   &buf_ptr_bytes_2);

    if (buf_ptr_bytes_2 > 0) {
      // We have a wrap around when reading the buffer. Copy the buffer data to
      // |data| and point to it.
      memcpy(data, buf_ptr_1, buf_ptr_bytes_1);
      memcpy(((char*) data) + buf_ptr_bytes_1, buf_ptr_2, buf_ptr_bytes_2);
      buf_ptr_1 = data;
    } else if (!data_ptr) {
      // No wrap, but a memcpy was requested.
      memcpy(data, buf_ptr_1, buf_ptr_bytes_1);
    }
    if (data_ptr) {
      // |buf_ptr_1| == |data| in the case of a wrap.
      *data_ptr = buf_ptr_1;
    }

    // Update read position
    WebRtc_MoveReadPtr(self, (int) read_count);

    return read_count;
  }
}